

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2c-wrapper.h
# Opt level: O2

string * __thiscall
wasm::wasm2cMangle_abi_cxx11_(string *__return_storage_ptr__,wasm *this,Name name,Signature sig)

{
  uint *puVar1;
  wasm wVar2;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar3;
  Type type;
  int iVar4;
  uintptr_t *puVar5;
  size_t sVar6;
  char cVar7;
  wasm *pwVar8;
  undefined1 auVar9 [8];
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar10;
  undefined1 local_200 [8];
  stringstream ss;
  long local_1f0 [3];
  uint auStack_1d8 [88];
  string local_78 [8];
  anon_class_1_0_00000001 wasm2cSignature;
  Type local_58;
  Signature sig_local;
  
  local_58.id = name.super_IString.str._M_str;
  sig_local.params.id = sig.params.id.id;
  sig_local.results.id = local_58.id;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"Z_",(allocator<char> *)local_200);
  for (pwVar8 = (wasm *)0x0; cVar7 = (char)__return_storage_ptr__, this != pwVar8;
      pwVar8 = pwVar8 + 1) {
    wVar2 = pwVar8[name.super_IString.str._M_len];
    iVar4 = isalnum((uint)(byte)wVar2);
    if ((wVar2 == (wasm)0x5f) || ((byte)wVar2 != 0x5a && iVar4 != 0)) {
      std::__cxx11::string::push_back(cVar7);
    }
    else {
      std::__cxx11::string::push_back(cVar7);
      std::__cxx11::stringstream::stringstream((stringstream *)local_200);
      *(uint *)((long)auStack_1d8 + *(long *)(local_1f0[0] + -0x18)) =
           *(uint *)((long)auStack_1d8 + *(long *)(local_1f0[0] + -0x18)) & 0xffffffb5 | 8;
      puVar1 = (uint *)((long)auStack_1d8 + *(long *)(local_1f0[0] + -0x18));
      *puVar1 = *puVar1 | 0x4000;
      std::ostream::_M_insert<unsigned_long>((ulong)local_1f0);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string(local_78);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_200);
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  wasm2cMangle::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)local_78,sig.params.id);
  type = sig_local.results;
  std::__cxx11::string::push_back(cVar7);
  if ((type.id & 1) == 0 || type.id < 7) {
    wasm2cMangle::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)local_78,type);
    std::__cxx11::string::push_back(cVar7);
  }
  else {
    _ss = 0;
    local_200 = (undefined1  [8])&local_58;
    PVar10 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)Type::end(&local_58);
    sVar6 = 0;
    auVar9 = (undefined1  [8])&local_58;
    while (PVar3.index = sVar6, PVar3.parent = (Type *)auVar9, PVar10 != PVar3) {
      puVar5 = (uintptr_t *)::wasm::Type::Iterator::operator*((Iterator *)local_200);
      wasm2cMangle::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)local_78,(Type)*puVar5);
      std::__cxx11::string::push_back(cVar7);
      sVar6 = _ss + 1;
      auVar9 = local_200;
      _ss = sVar6;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string wasm2cMangle(Name name, Signature sig) {
  const char escapePrefix = 'Z';
  std::string mangled = "Z_";
  for (unsigned char c : name.str) {
    if ((isalnum(c) && c != escapePrefix) || c == '_') {
      // This character is ok to emit as it is.
      mangled += c;
    } else {
      // This must be escaped, as prefix + hex character code.
      mangled += escapePrefix;
      std::stringstream ss;
      ss << std::hex << std::uppercase << unsigned(c);
      mangled += ss.str();
    }
  }

  // Emit the result and params.
  mangled += "Z_";

  auto wasm2cSignature = [](Type type) {
    TODO_SINGLE_COMPOUND(type);
    switch (type.getBasic()) {
      case Type::none:
        return 'v';
      case Type::i32:
        return 'i';
      case Type::i64:
        return 'j';
      case Type::f32:
        return 'f';
      case Type::f64:
        return 'd';
      default:
        Fatal() << "unhandled wasm2c wrapper signature type: " << type;
    }
  };

  mangled += wasm2cSignature(sig.results);
  if (sig.params.isTuple()) {
    for (const auto& param : sig.params) {
      mangled += wasm2cSignature(param);
    }
  } else {
    mangled += wasm2cSignature(sig.params);
  }

  return mangled;
}